

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-init.c
# Opt level: O2

void borg_init(void)

{
  uint32_t *puVar1;
  feature *pfVar2;
  _Bool _Var3;
  wchar_t i;
  uint32_t uVar4;
  int iVar5;
  void *p;
  player_class *ppVar6;
  long lVar7;
  long lVar8;
  
  do_cmd_redraw();
  borg_note("Initializing the Borg... (memory)");
  borg_init_failure = false;
  Term_fresh();
  p = mem_zalloc(0x64000);
  mem_free(p);
  if (borg_rand_local == 0) {
    uVar4 = Rand_div(0x10000000);
    borg_rand_local = uVar4 + 1;
  }
  borg.player = player;
  borg_note("Initializing the Borg... (borg.txt)");
  _Var3 = borg_init_txt_file();
  borg_note("Initializing the Borg... (options)");
  Term_fresh();
  if ((screensaver != false) || (borg_cfg[0x12] != 0)) {
    option_set("cheat_live",1);
  }
  if (borg_graphics == false) {
    for (lVar7 = 1; pfVar2 = f_info, lVar7 != 0x19; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        feat_x_attr[lVar8][lVar7] = pfVar2[lVar7].d_attr;
        feat_x_char[lVar8][lVar7] = pfVar2[lVar7].d_char;
      }
    }
  }
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x10000;
  borg_note("Initializing the Borg... (various)");
  Term_fresh();
  borg_cheat_death = (player->opts).opt[0x1c];
  borg_init_messages();
  borg_init_io();
  borg_init_item_val();
  borg_init_item_activation();
  borg_init_cave();
  borg_init_flow();
  borg_init_item_wear();
  borg_init_flow_take();
  borg_init_flow_kill();
  borg_init_item();
  borg_init_store();
  borg_init_update();
  borg_prepare_book_info();
  game_closed = false;
  event_add_handler(EVENT_LEAVE_GAME,borg_leave_game,(void *)0x0);
  borg_note("Initializing the Borg... done.");
  borg_t = 10;
  ppVar6 = player_id2class(0);
  iVar5 = strcmp(ppVar6->name,"Warrior");
  if (iVar5 == 0) {
    ppVar6 = player_id2class(1);
    iVar5 = strcmp(ppVar6->name,"Mage");
    if (iVar5 == 0) {
      ppVar6 = player_id2class(2);
      iVar5 = strcmp(ppVar6->name,"Druid");
      if (iVar5 == 0) {
        ppVar6 = player_id2class(3);
        iVar5 = strcmp(ppVar6->name,"Priest");
        if (iVar5 == 0) {
          ppVar6 = player_id2class(4);
          iVar5 = strcmp(ppVar6->name,"Necromancer");
          if (iVar5 == 0) {
            ppVar6 = player_id2class(5);
            iVar5 = strcmp(ppVar6->name,"Paladin");
            if (iVar5 == 0) {
              ppVar6 = player_id2class(6);
              iVar5 = strcmp(ppVar6->name,"Rogue");
              if (iVar5 == 0) {
                ppVar6 = player_id2class(7);
                iVar5 = strcmp(ppVar6->name,"Ranger");
                if (iVar5 == 0) {
                  ppVar6 = player_id2class(8);
                  iVar5 = strcmp(ppVar6->name,"Blackguard");
                  if (iVar5 == 0) goto LAB_00214c8b;
                }
              }
            }
          }
        }
      }
    }
  }
  borg_note("**STARTUP FAILURE** classes do not match");
  borg_init_failure = true;
LAB_00214c8b:
  if (borg_cfg[0x20] == 0) {
    if ((player->opts).opt[0x20] == true) {
      borg_note("**STARTUP FAILURE** must allow up stairs");
      borg_note("** birth option failure **");
      borg_init_failure = true;
    }
    if ((player->opts).opt[0x1f] == false) {
      borg_note("**STARTUP FAILURE** must connect stairs");
      borg_note("** birth option failure **");
      borg_init_failure = true;
    }
    if ((player->opts).opt[0x21] == true) {
      borg_note("**STARTUP FAILURE** must allow recall");
      borg_note("** birth option failure **");
      borg_init_failure = true;
    }
    if ((player->opts).opt[0x2c] == true) {
      borg_note("**STARTUP FAILURE** strange damage calculation");
      borg_note("** birth option failure **");
      borg_init_failure = true;
    }
  }
  if (!_Var3 && borg_init_failure == false) {
    borg_note("# Ready...");
  }
  borg_initialized = true;
  return;
}

Assistant:

void borg_init(void)
{
    uint8_t *memory_test;
    bool    warning_given;

    /*** Hack -- verify system ***/
    /* Redraw everything */
    do_cmd_redraw();

    /* Message */
    borg_note("Initializing the Borg... (memory)");
    borg_init_failure = false;

    /* Hack -- flush it */
    Term_fresh();

    /* Mega-Hack -- verify memory */
    memory_test = mem_zalloc(400 * 1024L * sizeof(uint8_t));
    mem_free(memory_test);
    memory_test = NULL;

    /* Prapare a local random number seed */
    if (!borg_rand_local)
        borg_rand_local = randint1(0x10000000);

    borg.player = player; /* HACK work around msvc issue */

    /*** Hack -- initialize borg.ini options ***/

    /* Message */
    borg_note("Initializing the Borg... (borg.txt)");
    warning_given = borg_init_txt_file();

    /*** Hack -- initialize game options ***/

    /* Message */
    borg_note("Initializing the Borg... (options)");

    /* Hack -- flush it */
    Term_fresh();

    /* Make sure it rolls up a new guy at death */
    if (screensaver || borg_cfg[BORG_CHEAT_DEATH]) {
        /* We need the borg to keep playing after he dies */
        option_set("cheat_live", true);
    }

#ifndef ALLOW_BORG_GRAPHICS
    if (!borg_graphics) {
        int i, j;
        /* Reset the # and % -- Scan the features */
        for (i = 1; i < FEAT_MAX; i++) {
            struct feature *f_ptr = &f_info[i];
#if false
            /* Skip non-features */
            if (!f_ptr->name) continue;

            /* Switch off "graphics" */
            f_ptr->x_attr[3] = f_ptr->d_attr;
            f_ptr->x_char[3] = f_ptr->d_char;
#endif

            /* Assume we will use the underlying values */
            for (j = 0; j < LIGHTING_MAX; j++) {
                feat_x_attr[j][i] = f_ptr->d_attr;
                feat_x_char[j][i] = f_ptr->d_char;
            }
        }
    }
#endif

#ifdef USE_GRAPHICS
    /* The Borg can't work with graphics on, so switch it off */
    if (use_graphics) {
        /* Reset to ASCII mode */
        use_graphics = false;
        arg_graphics = false;

        /* Reset visuals */
        reset_visuals(true);
    }
#endif /* USE_GRAPHICS */

    /*** Redraw ***/
    /* Redraw map */
    player->upkeep->redraw |= (PR_MAP);

    /*** Various ***/

    /* Message */
    borg_note("Initializing the Borg... (various)");

    /* Hack -- flush it */
    Term_fresh();

    /*** Cheat / Panic ***/

    /* more cheating */
    borg_cheat_death = false;

    /* set the continuous play mode if the game cheat death is on */
    if (OPT(player, cheat_live))
        borg_cheat_death = true;

    /*** Initialize ***/

    borg_init_messages();

    /* Initialize */
    borg_init_io();
    borg_init_item_val();
    borg_init_item_activation();

    /*** Grids ***/
    borg_init_cave();
    borg_init_flow();

    borg_init_item_wear();
    borg_init_flow_take();
    borg_init_flow_kill();

    borg_init_item();
    borg_init_store();
    /*** Object/Monster tracking ***/
    borg_init_update();

    /*** Hack -- react to race and class ***/

    /* Notice the new race and class */
    borg_prepare_race_class_info();

    /*
     * Notice if the game is closed so a reinitialization can be done if the
     * game is restarted without exiting.
     */
    game_closed = false;
    event_add_handler(EVENT_LEAVE_GAME, borg_leave_game, NULL);

    /*** All done ***/

    /* Done initialization */
    borg_note("Initializing the Borg... done.");

    /* Reset the clock */
    borg_t = 10;

    /* note: I would check if player_id2class returns null but it */
    /* never does, even on a bad class */
    if (!streq(player_id2class(CLASS_WARRIOR)->name, "Warrior")
        || !streq(player_id2class(CLASS_MAGE)->name, "Mage")
        || !streq(player_id2class(CLASS_DRUID)->name, "Druid")
        || !streq(player_id2class(CLASS_PRIEST)->name, "Priest")
        || !streq(player_id2class(CLASS_NECROMANCER)->name, "Necromancer")
        || !streq(player_id2class(CLASS_PALADIN)->name, "Paladin")
        || !streq(player_id2class(CLASS_ROGUE)->name, "Rogue")
        || !streq(player_id2class(CLASS_RANGER)->name, "Ranger")
        || !streq(player_id2class(CLASS_BLACKGUARD)->name, "Blackguard")) {
        borg_note("**STARTUP FAILURE** classes do not match");
        borg_init_failure = true;
    }

    /* Don't allow the user to do stupid things unless they ask to */
    if (!borg_cfg[BORG_ALLOW_STRANGE_OPTS]) {
        if (OPT(player, birth_force_descend)) {
            borg_note("**STARTUP FAILURE** must allow up stairs");
            borg_note("** birth option failure **");
            borg_init_failure = true;
        }

        if (!OPT(player, birth_connect_stairs)) {
            borg_note("**STARTUP FAILURE** must connect stairs");
            borg_note("** birth option failure **");
            borg_init_failure = true;
        }

        if (OPT(player, birth_no_recall)) {
            borg_note("**STARTUP FAILURE** must allow recall");
            borg_note("** birth option failure **");
            borg_init_failure = true;
        }

        if (OPT(player, birth_percent_damage)) {
            borg_note("**STARTUP FAILURE** strange damage calculation");
            borg_note("** birth option failure **");
            borg_init_failure = true;
        }
    }

    /* Official message */
    if (!borg_init_failure && !warning_given)
        borg_note("# Ready...");

    /* Now it is ready */
    borg_initialized = true;
}